

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O3

EffectProps * __thiscall
anon_unknown.dwarf_12ff03::AutowahStateFactory::getDefaultProps
          (EffectProps *__return_storage_ptr__,AutowahStateFactory *this)

{
  *(float *)((long)__return_storage_ptr__ + 0x5c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x60) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 100) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x68) = 0.0;
  *(undefined8 *)((__return_storage_ptr__->Reverb).LateReverbPan + 2) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x58) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x5c) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[1] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[1] = 0.0;
  *(bool *)((long)__return_storage_ptr__ + 0x30) = false;
  *(undefined3 *)((long)__return_storage_ptr__ + 0x31) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x34) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x38) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[0] = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x20) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x24) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x28) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x2c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x10) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x14) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x18) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x1c) = 0.0;
  *(int *)__return_storage_ptr__ = 0x3d75c28f;
  *(int *)((long)__return_storage_ptr__ + 4) = 0x3d75c28f;
  *(float *)((long)__return_storage_ptr__ + 8) = 1000.0;
  *(float *)((long)__return_storage_ptr__ + 0xc) = 11.22;
  return __return_storage_ptr__;
}

Assistant:

EffectProps AutowahStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Autowah.AttackTime = AL_AUTOWAH_DEFAULT_ATTACK_TIME;
    props.Autowah.ReleaseTime = AL_AUTOWAH_DEFAULT_RELEASE_TIME;
    props.Autowah.Resonance = AL_AUTOWAH_DEFAULT_RESONANCE;
    props.Autowah.PeakGain = AL_AUTOWAH_DEFAULT_PEAK_GAIN;
    return props;
}